

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_ConvertToRgb(ConvertToRgbForm1 ConvertToRgb)

{
  uint8_t value;
  byte bVar1;
  const_reference pvVar2;
  code *in_RDI;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  Image *image;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t width_;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar4;
  Image *in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint8_t in_stack_ffffffffffffff6f;
  undefined1 local_48 [40];
  code *local_8;
  
  image = (Image *)&stack0xffffffffffffffe0;
  uVar3 = 1;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  width_ = 0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,0);
  uVar4 = CONCAT13(*pvVar2,(int3)in_stack_ffffffffffffff54);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar4,uVar3),width_,in_stack_ffffffffffffff48,
             (uint8_t)((ulong)image >> 0x38),(uint8_t)((ulong)image >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             in_stack_ffffffffffffff58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d18a5);
  (*local_8)(&stack0xffffffffffffff58,local_48);
  value = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount
                    ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffff58);
  bVar1 = false;
  if (value == '\x03') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,0);
    bVar1 = Unit_Test::verifyImage(image,value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d1920);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d192d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar4,uVar3));
  return (bool)(bVar1 & 1);
}

Assistant:

bool form1_ConvertToRgb(ConvertToRgbForm1 ConvertToRgb)
    {
        const std::vector < uint8_t > intensity = intensityArray( 1 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );

        const PenguinV_Image::Image output = ConvertToRgb( input );

        return output.colorCount() == PenguinV_Image::RGB && verifyImage( output, intensity[0] );
    }